

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O1

DdNode * cuddAddApplyRecur(DdManager *dd,DD_AOP op,DdNode *f,DdNode *g)

{
  int *piVar1;
  DdHalfWord index;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  uint uVar5;
  DdNode *g_00;
  uint uVar6;
  DdNode *g_01;
  DdNode *local_40;
  DdNode *local_38;
  
  local_40 = g;
  local_38 = f;
  pDVar2 = (*op)(dd,&local_38,&local_40);
  if ((pDVar2 == (DdNode *)0x0) &&
     (pDVar2 = cuddCacheLookup2(dd,(DD_CTFP)op,local_38,local_40), pDVar2 == (DdNode *)0x0)) {
    uVar5 = 0x7fffffff;
    uVar6 = 0x7fffffff;
    if ((ulong)local_38->index != 0x7fffffff) {
      uVar6 = dd->perm[local_38->index];
    }
    if ((ulong)local_40->index != 0x7fffffff) {
      uVar5 = dd->perm[local_40->index];
    }
    pDVar2 = local_40;
    pDVar3 = local_38;
    pDVar4 = local_38;
    if (uVar6 <= uVar5) {
      pDVar2 = local_38;
      pDVar3 = (local_38->type).kids.T;
      pDVar4 = (local_38->type).kids.E;
    }
    g_00 = local_40;
    g_01 = local_40;
    if (uVar5 <= uVar6) {
      g_00 = (local_40->type).kids.T;
      g_01 = (local_40->type).kids.E;
    }
    index = pDVar2->index;
    pDVar2 = cuddAddApplyRecur(dd,op,pDVar3,g_00);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar3 = cuddAddApplyRecur(dd,op,pDVar4,g_01);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = pDVar2;
        if (pDVar2 != pDVar3) {
          pDVar4 = cuddUniqueInter(dd,index,pDVar2,pDVar3);
        }
        if (pDVar4 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert2(dd,(DD_CTFP)op,local_38,local_40,pDVar4);
          return pDVar4;
        }
        Cudd_RecursiveDeref(dd,pDVar2);
        pDVar2 = pDVar3;
      }
      Cudd_RecursiveDeref(dd,pDVar2);
    }
    pDVar2 = (DdNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddAddApplyRecur(
  DdManager * dd,
  DD_AOP op,
  DdNode * f,
  DdNode * g)
{
    DdNode *res,
           *fv, *fvn, *gv, *gvn,
           *T, *E;
    unsigned int ford, gord;
    unsigned int index;
    DD_CTFP cacheOp;

    /* Check terminal cases. Op may swap f and g to increase the
     * cache hit rate.
     */
    statLine(dd);
    res = (*op)(dd,&f,&g);
    if (res != NULL) return(res);

    /* Check cache. */
    cacheOp = (DD_CTFP) op;
    res = cuddCacheLookup2(dd,cacheOp,f,g);
    if (res != NULL) return(res);

    /* Recursive step. */
    ford = cuddI(dd,f->index);
    gord = cuddI(dd,g->index);
    if (ford <= gord) {
        index = f->index;
        fv = cuddT(f);
        fvn = cuddE(f);
    } else {
        index = g->index;
        fv = fvn = f;
    }
    if (gord <= ford) {
        gv = cuddT(g);
        gvn = cuddE(g);
    } else {
        gv = gvn = g;
    }

    T = cuddAddApplyRecur(dd,op,fv,gv);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = cuddAddApplyRecur(dd,op,fvn,gvn);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);

    res = (T == E) ? T : cuddUniqueInter(dd,(int)index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,cacheOp,f,g,res);

    return(res);

}